

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullstrcmp.c
# Opt level: O0

int nullstrcmp(char *a,char *b)

{
  char *b_local;
  char *a_local;
  
  if ((a == (char *)0x0) && (b == (char *)0x0)) {
    a_local._4_4_ = 0;
  }
  else if (a == (char *)0x0) {
    a_local._4_4_ = -1;
  }
  else if (b == (char *)0x0) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = strcmp(a,b);
  }
  return a_local._4_4_;
}

Assistant:

int nullstrcmp(const char *a, const char *b)
{
    if (a == NULL && b == NULL)
        return 0;
    if (a == NULL)
        return -1;
    if (b == NULL)
        return +1;
    return strcmp(a, b);
}